

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::RemoveForce(ChBody *this,shared_ptr<chrono::ChForce> *mforce)

{
  shared_ptr<chrono::ChForce> *psVar1;
  ChSystem *pCVar2;
  __normal_iterator<std::shared_ptr<chrono::ChForce>_*,_std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  _Var3;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChForce>*,std::vector<std::shared_ptr<chrono::ChForce>,std::allocator<std::shared_ptr<chrono::ChForce>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChForce>const>>
                    ((this->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,mforce);
  psVar1 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current != psVar1) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChForce>*,std::vector<std::shared_ptr<chrono::ChForce>,std::allocator<std::shared_ptr<chrono::ChForce>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChForce>const>>
                      ((this->forcelist).
                       super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,psVar1,mforce);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    _M_erase(&this->forcelist,(iterator)_Var3._M_current);
    ((mforce->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
         (ChBody *)0x0;
    pCVar2 = (this->super_ChPhysicsItem).system;
    if (pCVar2 != (ChSystem *)0x0) {
      pCVar2->is_updated = false;
    }
    return;
  }
  __assert_fail("std::find<std::vector<std::shared_ptr<ChForce>>::iterator>(forcelist.begin(), forcelist.end(), mforce) != forcelist.end()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBody.cpp"
                ,0x20a,"void chrono::ChBody::RemoveForce(std::shared_ptr<ChForce>)");
}

Assistant:

void ChBody::RemoveForce(std::shared_ptr<ChForce> mforce) {
    // trying to remove objects not previously added?
    assert(std::find<std::vector<std::shared_ptr<ChForce>>::iterator>(forcelist.begin(), forcelist.end(), mforce) !=
           forcelist.end());

    // warning! linear time search
    forcelist.erase(
        std::find<std::vector<std::shared_ptr<ChForce>>::iterator>(forcelist.begin(), forcelist.end(), mforce));

    mforce->SetBody(0);

    // If the body is already added to a system, mark the system out-of-date
    if (system) {
        system->is_updated = false;
    }
}